

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintCharAndCodeTo<unsigned_char>(uchar c,ostream *os)

{
  char *pcVar1;
  ostream *poVar2;
  ostream *in_RSI;
  byte in_DIL;
  CharFormat format;
  int in_stack_ffffffffffffff9c;
  ostream *in_stack_ffffffffffffffa8;
  string *psVar3;
  uchar c_00;
  string local_38 [36];
  CharFormat local_14;
  ostream *local_10;
  byte local_1;
  
  local_10 = in_RSI;
  local_1 = in_DIL;
  pcVar1 = GetCharWidthPrefix(in_DIL);
  poVar2 = std::operator<<(in_RSI,pcVar1);
  c_00 = (uchar)((ulong)in_RSI >> 0x18);
  std::operator<<(poVar2,"\'");
  local_14 = PrintAsCharLiteralTo<unsigned_char>(c_00,in_stack_ffffffffffffffa8);
  std::operator<<(local_10,"\'");
  if (local_1 != 0) {
    poVar2 = std::operator<<(local_10," (");
    std::ostream::operator<<(poVar2,(uint)local_1);
    if ((local_14 != kHexEscape) && ((local_1 == 0 || (9 < local_1)))) {
      poVar2 = std::operator<<(local_10,", 0x");
      psVar3 = local_38;
      String::FormatHexInt_abi_cxx11_(in_stack_ffffffffffffff9c);
      std::operator<<(poVar2,psVar3);
      std::__cxx11::string::~string(local_38);
    }
    std::operator<<(local_10,")");
  }
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << GetCharWidthPrefix(c) << "'";
  const CharFormat format = PrintAsCharLiteralTo(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0) return;
  *os << " (" << static_cast<int>(c);

  // For more convenience, we print c's code again in hexadecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << ", 0x" << String::FormatHexInt(static_cast<int>(c));
  }
  *os << ")";
}